

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_all.c
# Opt level: O0

int X509_digest(X509 *data,EVP_MD *type,uchar *md,uint *len)

{
  int iVar1;
  uchar *unaff_retaddr;
  void *in_stack_00000008;
  EVP_MD *in_stack_00000010;
  ASN1_ITEM *in_stack_00000018;
  char *in_stack_00000030;
  EVP_MD *in_stack_ffffffffffffffc8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = EVP_MD_is_a(in_stack_ffffffffffffffc8,(char *)0x2db589);
  if (((iVar1 == 0) || ((((OSSL_LIB_CTX *)data)->dyn_indexes[0xe] & 0x100U) == 0)) ||
     ((((OSSL_LIB_CTX *)data)->dyn_indexes[0xe] & 0x100000U) != 0)) {
    X509_it();
    iVar1 = ossl_asn1_item_digest_ex
                      (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
                       (uint *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (OSSL_LIB_CTX *)data,in_stack_00000030);
  }
  else {
    if (len != (uint *)0x0) {
      *len = 0x14;
    }
    *(CRYPTO_RWLOCK **)md = ((OSSL_LIB_CTX *)data)->index_locks[7];
    *(CRYPTO_RWLOCK **)(md + 8) = ((OSSL_LIB_CTX *)data)->index_locks[8];
    *(undefined4 *)(md + 0x10) = *(undefined4 *)(((OSSL_LIB_CTX *)data)->index_locks + 9);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int X509_digest(const X509 *cert, const EVP_MD *md, unsigned char *data,
                unsigned int *len)
{
    if (EVP_MD_is_a(md, SN_sha1) && (cert->ex_flags & EXFLAG_SET) != 0
            && (cert->ex_flags & EXFLAG_NO_FINGERPRINT) == 0) {
        /* Asking for SHA1 and we already computed it. */
        if (len != NULL)
            *len = sizeof(cert->sha1_hash);
        memcpy(data, cert->sha1_hash, sizeof(cert->sha1_hash));
        return 1;
    }
    return ossl_asn1_item_digest_ex(ASN1_ITEM_rptr(X509), md, (char *)cert,
                                    data, len, cert->libctx, cert->propq);
}